

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int validate_typed_array(JSContext *ctx,JSValue this_val)

{
  if (((int)this_val.tag == -1) && ((ushort)(*(short *)((long)this_val.u.ptr + 6) - 0x15U) < 9)) {
    if (*(char *)(*(long *)(*(long *)(*(long *)((long)this_val.u.ptr + 0x30) + 0x18) + 0x30) + 4) ==
        '\0') {
      return 0;
    }
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
  }
  else {
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
  }
  return -1;
}

Assistant:

static int validate_typed_array(JSContext *ctx, JSValueConst this_val)
{
    JSObject *p;
    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return 0;
}